

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

bool __thiscall
slang::ast::MethodPrototypeSymbol::checkMethodMatch
          (MethodPrototypeSymbol *this,Scope *scope,SubroutineSymbol *method)

{
  pointer ppFVar1;
  long lVar2;
  SyntaxNode *this_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar3;
  Type *rhs;
  Type *pTVar4;
  Diagnostic *pDVar5;
  Diagnostic *this_01;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  string_view arg;
  ArgList AVar9;
  SourceRange sourceRange;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  if (method->subroutineKind != this->subroutineKind) {
    this_01 = Scope::addDiag(scope,(DiagCode)0x750006,(this->super_Symbol).location);
    this = (MethodPrototypeSymbol *)method;
    goto LAB_0033dc43;
  }
  rhs = DeclaredType::getType(&this->declaredReturnType);
  pTVar4 = DeclaredType::getType(&method->declaredReturnType);
  bVar3 = Type::isMatching(pTVar4,rhs);
  if (((bVar3) || (bVar3 = Type::isError(pTVar4), bVar3)) || (bVar3 = Type::isError(rhs), bVar3)) {
    AVar9 = SubroutineSymbol::getArguments(method);
    if (AVar9._M_extent._M_extent_value._M_extent_value !=
        (this->arguments)._M_extent._M_extent_value) {
      this_01 = Scope::addDiag(scope,(DiagCode)0x6f0006,(method->super_Symbol).location);
      Diagnostic::operator<<(this_01,(this->super_Symbol).name);
      goto LAB_0033dc43;
    }
    ppFVar1 = (this->arguments)._M_ptr;
    lVar8 = 0;
    while( true ) {
      if (AVar9._M_extent._M_extent_value._M_extent_value << 3 == lVar8) {
        return true;
      }
      lVar2 = *(long *)((long)AVar9._M_ptr + lVar8);
      if (*(size_t *)(lVar2 + 8) != 0) break;
LAB_0033daf0:
      lVar8 = lVar8 + 8;
    }
    this = *(MethodPrototypeSymbol **)((long)ppFVar1 + lVar8);
    __y._M_len = (((SubroutineSymbol *)this)->super_Symbol).name._M_len;
    __y._M_str = (((SubroutineSymbol *)this)->super_Symbol).name._M_str;
    __x._M_str = *(char **)(lVar2 + 0x10);
    __x._M_len = *(size_t *)(lVar2 + 8);
    bVar3 = std::operator==(__x,__y);
    if ((bVar3) || ((((SubroutineSymbol *)this)->super_Symbol).name._M_len == 0)) {
      pTVar4 = DeclaredType::getType((DeclaredType *)(lVar2 + 0x40));
      rhs = DeclaredType::getType((DeclaredType *)&((SubroutineSymbol *)this)->super_Scope);
      bVar3 = Type::isMatching(pTVar4,rhs);
      if ((!bVar3) &&
         ((bVar3 = Type::isError(pTVar4), !bVar3 && (bVar3 = Type::isError(rhs), !bVar3)))) {
        this_01 = Scope::addDiag(scope,(DiagCode)0x740006,*(SourceLocation *)(lVar2 + 0x18));
        pDVar5 = Diagnostic::operator<<(this_01,*(string_view *)(lVar2 + 8));
        pDVar5 = ast::operator<<(pDVar5,pTVar4);
        goto LAB_0033dc3e;
      }
      if (*(int *)(lVar2 + 0x158) ==
          *(int *)&(((SubroutineSymbol *)((long)this + 0x120))->super_Symbol).originatingSyntax)
      goto LAB_0033daf0;
      pDVar5 = Scope::addDiag(scope,(DiagCode)0x710006,*(SourceLocation *)(lVar2 + 0x18));
      sVar7 = *(size_t *)(lVar2 + 8);
      pcVar6 = *(char **)(lVar2 + 0x10);
      this_01 = pDVar5;
    }
    else {
      this_01 = Scope::addDiag(scope,(DiagCode)0x720006,*(SourceLocation *)(lVar2 + 0x18));
      pDVar5 = Diagnostic::operator<<(this_01,*(string_view *)(lVar2 + 8));
      sVar7 = (((SubroutineSymbol *)this)->super_Symbol).name._M_len;
      pcVar6 = (((SubroutineSymbol *)this)->super_Symbol).name._M_str;
    }
    arg._M_str = pcVar6;
    arg._M_len = sVar7;
    Diagnostic::operator<<(pDVar5,arg);
  }
  else {
    this_00 = (SyntaxNode *)(this->declaredReturnType).typeOrLink.typeSyntax;
    if (this_00 == (SyntaxNode *)0x0 || *(int *)&(this->declaredReturnType).field_0x3c < 0) {
      pDVar5 = Scope::addDiag(scope,(DiagCode)0x760006,(this->super_Symbol).location);
    }
    else {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
      pDVar5 = Scope::addDiag(scope,(DiagCode)0x760006,sourceRange);
    }
    ast::operator<<(pDVar5,pTVar4);
    Diagnostic::operator<<(pDVar5,(method->super_Symbol).name);
    this = (MethodPrototypeSymbol *)method;
    this_01 = pDVar5;
LAB_0033dc3e:
    ast::operator<<(pDVar5,rhs);
  }
LAB_0033dc43:
  Diagnostic::addNote(this_01,(DiagCode)0x50001,(((SubroutineSymbol *)this)->super_Symbol).location)
  ;
  return false;
}

Assistant:

bool MethodPrototypeSymbol::checkMethodMatch(const Scope& scope,
                                             const SubroutineSymbol& method) const {
    if (method.subroutineKind != subroutineKind) {
        auto& diag = scope.addDiag(diag::MethodKindMismatch, location);
        diag.addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    // Check that return type and arguments match what was declared in the prototype.
    auto& protoRetType = getReturnType();
    auto& defRetType = method.getReturnType();
    if (!defRetType.isMatching(protoRetType) && !defRetType.isError() && !protoRetType.isError()) {
        Diagnostic* diag;
        auto typeSyntax = declaredReturnType.getTypeSyntax();
        if (typeSyntax)
            diag = &scope.addDiag(diag::MethodReturnMismatch, typeSyntax->sourceRange());
        else
            diag = &scope.addDiag(diag::MethodReturnMismatch, location);

        (*diag) << defRetType;
        (*diag) << method.name;
        (*diag) << protoRetType;
        diag->addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    auto defArgs = method.getArguments();
    auto protoArgs = arguments;
    if (defArgs.size() != protoArgs.size()) {
        auto& diag = scope.addDiag(diag::MethodArgCountMismatch, method.location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, location);
        return false;
    }

    for (auto di = defArgs.begin(), pi = protoArgs.begin(); di != defArgs.end(); di++, pi++) {
        // Names must be identical.
        const FormalArgumentSymbol* da = *di;
        const FormalArgumentSymbol* pa = *pi;

        // The subroutine itself shouldn't have empty argument names.
        // If it does the parser already errored.
        if (da->name.empty())
            continue;

        if (da->name != pa->name && !pa->name.empty()) {
            auto& diag = scope.addDiag(diag::MethodArgNameMismatch, da->location);
            diag << da->name << pa->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Types must match.
        const Type& dt = da->getType();
        const Type& pt = pa->getType();
        if (!dt.isMatching(pt) && !dt.isError() && !pt.isError()) {
            auto& diag = scope.addDiag(diag::MethodArgTypeMismatch, da->location);
            diag << da->name << dt << pt;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Direction must match.
        if (da->direction != pa->direction) {
            auto& diag = scope.addDiag(diag::MethodArgDirectionMismatch, da->location);
            diag << da->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }
    }

    return true;
}